

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cm_lock.c
# Opt level: O0

void IntCManager_unlock(CManager cm,char *file,int line)

{
  FILE *__stream;
  int iVar1;
  __pid_t _Var2;
  pthread_t pVar3;
  uint in_EDX;
  undefined8 in_RSI;
  long in_RDI;
  CMTraceType in_stack_0000000c;
  timespec ts;
  timespec local_28;
  uint local_14;
  undefined8 local_10;
  long local_8;
  
  local_14 = in_EDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  if (*(long *)(in_RDI + 0x120) == 0) {
    iVar1 = CMtrace_init((CManager)ts.tv_sec,in_stack_0000000c);
    if (iVar1 == 0) goto LAB_0012d170;
  }
  else if (CMtrace_val[3] == 0) goto LAB_0012d170;
  if (CMtrace_PID != 0) {
    __stream = *(FILE **)(local_8 + 0x120);
    _Var2 = getpid();
    pVar3 = pthread_self();
    fprintf(__stream,"P%lxT%lx - ",(long)_Var2,pVar3);
  }
  if (CMtrace_timing != 0) {
    clock_gettime(1,&local_28);
    fprintf(*(FILE **)(local_8 + 0x120),"%lld.%.9ld - ",local_28.tv_sec,local_28.tv_nsec);
  }
  fprintf(*(FILE **)(local_8 + 0x120),"CManager Unlock at \"%s\" line %d\n",local_10,(ulong)local_14
         );
LAB_0012d170:
  fflush(*(FILE **)(local_8 + 0x120));
  *(int *)(local_8 + 0xa0) = *(int *)(local_8 + 0xa0) + -1;
  if (*(int *)(local_8 + 0xa0) != 0) {
    printf("CManager unlock inconsistency, %d\n",(ulong)*(uint *)(local_8 + 0xa0));
  }
  pthread_mutex_unlock((pthread_mutex_t *)(local_8 + 0x78));
  return;
}

Assistant:

extern void
IntCManager_unlock(CManager cm, const char *file, int line)
{
    CMtrace_out(cm, CMLowLevelVerbose, "CManager Unlock at \"%s\" line %d\n",
		file, line);
    cm->locked--;
    if (cm->locked != 0) {
	printf("CManager unlock inconsistency, %d\n", cm->locked);
    }
    thr_mutex_unlock(cm->exchange_lock);
}